

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O2

void psocks_cmdline(psocks_state *ps,int argc,char **argv)

{
  char **ppcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  char *__format;
  char *pcVar8;
  size_t sStack_50;
  
  bVar7 = true;
  bVar6 = false;
  bVar3 = false;
LAB_00103b99:
  do {
    while( true ) {
      if (argc < 2) {
        return;
      }
      iVar5 = argc + -1;
      ppcVar1 = argv + 1;
      pcVar8 = argv[1];
      if (((bVar7) && (*pcVar8 == '-')) && (cVar2 = pcVar8[1], cVar2 != '\0')) break;
      if (bVar6) {
        BinarySink_put_asciz(ps->subcmd->binarysink_,pcVar8);
        bVar6 = true;
        argv = ppcVar1;
        argc = iVar5;
      }
      else {
        if (bVar3) {
          __format = "psocks: unexpected extra argument \'%s\'\n";
LAB_00103d55:
          fprintf(_stderr,__format,pcVar8);
          goto LAB_00103d5f;
        }
        iVar4 = atoi(pcVar8);
        ps->listen_port = iVar4;
        bVar6 = false;
        bVar3 = true;
        argv = ppcVar1;
        argc = iVar5;
      }
    }
    if (cVar2 == 'p') {
      if (pcVar8[2] == '\0') {
        if (ps->platform->open_pipes ==
            (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
          pcVar8 = "psocks: \'-p\' is not supported on this platform\n";
          sStack_50 = 0x2f;
          goto LAB_00103e49;
        }
        if (argc == 2) {
          pcVar8 = "psocks: expected an argument to \'-p\'\n";
          sStack_50 = 0x25;
          goto LAB_00103e49;
        }
        pcVar8 = dupstr(argv[2]);
        ps->rec_cmd = pcVar8;
        ps->rec_dest = REC_PIPE;
        bVar7 = true;
        argv = argv + 2;
        argc = argc + -2;
        goto LAB_00103b99;
      }
    }
    else if (cVar2 == 'd') {
      if (pcVar8[2] == '\0') {
        *(byte *)&ps->log_flags = (byte)ps->log_flags | 2;
LAB_00103c9b:
        bVar7 = true;
        argv = ppcVar1;
        argc = iVar5;
        goto LAB_00103b99;
      }
    }
    else if (cVar2 == 'f') {
      if (pcVar8[2] == '\0') {
        ps->rec_dest = REC_FILE;
        goto LAB_00103c9b;
      }
    }
    else if (cVar2 == 'g') {
      if (pcVar8[2] == '\0') {
        ps->acceptall = true;
        goto LAB_00103c9b;
      }
    }
    else if ((cVar2 == '-') && (bVar7 = false, argv = ppcVar1, argc = iVar5, pcVar8[2] == '\0'))
    goto LAB_00103b99;
    iVar4 = strcmp(pcVar8,"--exec");
    if (iVar4 != 0) {
      iVar5 = strcmp(pcVar8,"--help");
      if (iVar5 == 0) {
        printf("usage: psocks [ -d ] [ -f");
        if (ps->platform->open_pipes !=
            (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
          printf(" | -p pipe-cmd");
        }
        printf(" ] [ -g ] port-number");
        putchar(10);
        puts("where: -d           log all connection contents to standard output");
        puts("       -f           record each half-connection to a file sockin.N/sockout.N");
        if (ps->platform->open_pipes !=
            (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
          puts("       -p pipe-cmd  pipe each half-connection to \'pipe-cmd [in|out] N\'");
        }
        puts("       -g           accept connections from anywhere, not just localhost");
        if (ps->platform->start_subcommand != (_func_void_strbuf_ptr *)0x0) {
          puts("       --exec subcmd [args...]   run command, and terminate when it exits");
        }
        puts("       port-number  listen on this port (default 1080)");
        puts("also: psocks --help      display this help text");
        exit(0);
      }
      __format = "psocks: unrecognised option \'%s\'\n";
      goto LAB_00103d55;
    }
    bVar6 = true;
    bVar7 = false;
    argv = ppcVar1;
    argc = iVar5;
    if (ps->platform->start_subcommand == (_func_void_strbuf_ptr *)0x0) {
      pcVar8 = "psocks: running a subcommand is not supported on this platform\n";
      sStack_50 = 0x3f;
LAB_00103e49:
      fwrite(pcVar8,sStack_50,1,_stderr);
LAB_00103d5f:
      exit(1);
    }
  } while( true );
}

Assistant:

void psocks_cmdline(psocks_state *ps, int argc, char **argv)
{
    bool doing_opts = true;
    bool accumulating_exec_args = false;
    size_t args_seen = 0;

    while (--argc > 0) {
	const char *p = *++argv;

	if (doing_opts && p[0] == '-' && p[1]) {
            if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "-g")) {
		ps->acceptall = true;
            } else if (!strcmp(p, "-d")) {
		ps->log_flags |= LOG_DIALOGUE;
            } else if (!strcmp(p, "-f")) {
		ps->rec_dest = REC_FILE;
            } else if (!strcmp(p, "-p")) {
                if (!ps->platform->open_pipes) {
		    fprintf(stderr, "psocks: '-p' is not supported on this "
                            "platform\n");
		    exit(1);
                }
		if (--argc > 0) {
		    ps->rec_cmd = dupstr(*++argv);
		} else {
		    fprintf(stderr, "psocks: expected an argument to '-p'\n");
		    exit(1);
		}
		ps->rec_dest = REC_PIPE;
	    } else if (!strcmp(p, "--exec")) {
                if (!ps->platform->start_subcommand) {
		    fprintf(stderr, "psocks: running a subcommand is not "
                            "supported on this platform\n");
		    exit(1);
                }
                accumulating_exec_args = true;
                /* Now consume all further argv words for the
                 * subcommand, even if they look like options */
                doing_opts = false;
	    } else if (!strcmp(p, "--help")) {
                printf("usage: psocks [ -d ] [ -f");
                if (ps->platform->open_pipes)
                    printf(" | -p pipe-cmd");
                printf(" ] [ -g ] port-number");
                printf("\n");
                printf("where: -d           log all connection contents to"
                       " standard output\n");
                printf("       -f           record each half-connection to "
                       "a file sockin.N/sockout.N\n");
                if (ps->platform->open_pipes)
                    printf("       -p pipe-cmd  pipe each half-connection"
                           " to 'pipe-cmd [in|out] N'\n");
                printf("       -g           accept connections from anywhere,"
                       " not just localhost\n");
                if (ps->platform->start_subcommand)
                    printf("       --exec subcmd [args...]   run command, and "
                           "terminate when it exits\n");
                printf("       port-number  listen on this port"
                       " (default 1080)\n");
                printf("also: psocks --help      display this help text\n");
                exit(0);
            } else {
                fprintf(stderr, "psocks: unrecognised option '%s'\n", p);
                exit(1);
            }
	} else {
            if (accumulating_exec_args) {
                put_asciz(ps->subcmd, p);
            } else switch (args_seen++) {
              case 0:
                ps->listen_port = atoi(p);
                break;
              default:
                fprintf(stderr, "psocks: unexpected extra argument '%s'\n", p);
                exit(1);
                break;
            }
	}
    }
}